

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_rkv.c
# Opt level: O0

MPP_RET hal_vp9d_rkv_reset(void *hal)

{
  long lVar1;
  Vp9dRkvCtx *hw_ctx;
  HalVp9dCtx *p_hal;
  void *hal_local;
  
  lVar1 = *(long *)((long)hal + 0x40);
  if ((hal_vp9d_debug & 1) != 0) {
    _mpp_log_l(4,"hal_vp9d_rkv","(%d) enter\n","hal_vp9d_rkv_reset",0x27d);
  }
  memset((void *)(lVar1 + 0xf8),0,100);
  *(undefined4 *)(lVar1 + 0xe8) = 0xffffffff;
  *(undefined4 *)(lVar1 + 0xf0) = 0xffffffff;
  *(undefined4 *)(lVar1 + 0x15c) = 1;
  if ((hal_vp9d_debug & 1) != 0) {
    _mpp_log_l(4,"hal_vp9d_rkv","(%d) leave\n","hal_vp9d_rkv_reset",0x284);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_vp9d_rkv_reset(void *hal)
{
    HalVp9dCtx *p_hal = (HalVp9dCtx *)hal;
    Vp9dRkvCtx *hw_ctx = (Vp9dRkvCtx*)p_hal->hw_ctx;

    hal_vp9d_enter();

    memset(&hw_ctx->ls_info, 0, sizeof(hw_ctx->ls_info));
    hw_ctx->mv_base_addr = -1;
    hw_ctx->pre_mv_base_addr = -1;
    hw_ctx->last_segid_flag = 1;

    hal_vp9d_leave();

    return MPP_OK;
}